

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucitest.cc
# Opt level: O2

void __thiscall
UciTest_parseMovesA2A3A7A6_Test::UciTest_parseMovesA2A3A7A6_Test
          (UciTest_parseMovesA2A3A7A6_Test *this)

{
  test::UciTest::UciTest(&this->super_UciTest);
  (this->super_UciTest).super_BoardTest.super_UnitTest.super_Test._vptr_Test =
       (_func_int **)&PTR__BoardTest_00142ea0;
  return;
}

Assistant:

TEST_F(UciTest, parseMovesA2A3A7A6)
{
    io::uci::parsePosition("moves a2a3", pos);

    ASSERT_BOARD(pos,
                 {
                     {board::A3, board::WP},
                 },
                 board::BLACK, board::NO_SQ, 0);

    io::uci::parsePosition("moves a7a6", pos);

    ASSERT_BOARD(pos,
                 {
                     {board::A3, board::WP},
                     {board::A6, board::BP},
                 },
                 board::WHITE, board::NO_SQ, 0);
}